

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O3

uint __thiscall TURBOLINECOUNT::CLineCount::countThread(CLineCount *this,int thread_number)

{
  void *__s;
  int iVar1;
  void *__addr;
  void *pvVar2;
  int *piVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  size_t __len;
  long __offset;
  allocator<char> local_b1;
  long local_b0;
  size_t local_a8;
  long local_a0;
  CLineCount *local_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  lVar5 = this->m_filesize;
  local_a8 = (this->m_parameters).buffersize;
  local_b0 = (long)thread_number;
  __offset = local_a8 * local_b0;
  if (__offset < lVar5) {
    local_a0 = (long)this->m_actual_thread_count * local_a8;
    lVar6 = 0;
    __addr = (void *)0x0;
    sVar7 = 0;
    local_98 = this;
    do {
      this = local_98;
      if (local_98->m_thread_fail != false) {
        return 0xffffffff;
      }
      __len = lVar5 - __offset;
      if ((long)local_a8 < lVar5 - __offset) {
        __len = local_a8;
      }
      if ((__addr != (void *)0x0) && (iVar1 = munmap(__addr,sVar7), iVar1 != 0)) {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        pcVar4 = strerror(iVar1);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar4,&local_b1);
        this->m_lasterror = iVar1;
        std::__cxx11::string::_M_assign((string *)&this->m_lasterrorstring);
        if (local_50[0] != local_40) goto LAB_00102ff8;
        goto LAB_00103000;
      }
      __addr = mmap64((void *)0x0,__len,1,1,this->m_fh,__offset);
      __s = __addr;
      sVar7 = __len;
      if (__addr == (void *)0xffffffffffffffff) {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        pcVar4 = strerror(iVar1);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar4,&local_b1);
        this->m_lasterror = iVar1;
        std::__cxx11::string::_M_assign((string *)&this->m_lasterrorstring);
        local_40[0] = local_60[0];
        local_50[0] = local_70[0];
        if (local_70[0] != local_60) goto LAB_00102ff8;
        goto LAB_00103000;
      }
      while ((sVar7 != 0 && (pvVar2 = memchr(__s,10,sVar7), pvVar2 != (void *)0x0))) {
        lVar6 = lVar6 + 1;
        sVar7 = (long)__s + (sVar7 - ((long)pvVar2 + 1));
        __s = (void *)((long)pvVar2 + 1);
      }
      this = local_98;
      lVar5 = local_98->m_filesize;
      if (__len + __offset == lVar5) {
        lVar6 = lVar6 + (ulong)(*(char *)((long)__addr + (__len - 1)) != '\n');
      }
      __offset = __offset + local_a0;
      sVar7 = __len;
    } while (__offset < lVar5);
    if ((__addr != (void *)0x0) && (iVar1 = munmap(__addr,__len), iVar1 != 0)) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      pcVar4 = strerror(iVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_90,pcVar4,&local_b1);
      this->m_lasterror = iVar1;
      std::__cxx11::string::_M_assign((string *)&this->m_lasterrorstring);
      local_40[0] = local_80[0];
      local_50[0] = local_90[0];
      if (local_90[0] != local_80) {
LAB_00102ff8:
        operator_delete(local_50[0],local_40[0] + 1);
      }
LAB_00103000:
      this->m_thread_fail = true;
      return 0xffffffff;
    }
  }
  else {
    lVar6 = 0;
  }
  (this->m_threadlinecounts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start[local_b0] = lVar6;
  return 0;
}

Assistant:

unsigned int CLineCount::countThread(int thread_number)
{
	tlc_fileoffset_t buffersize = (tlc_fileoffset_t)m_parameters.buffersize;
	tlc_fileoffset_t startoffset = buffersize * (tlc_fileoffset_t)thread_number;
	tlc_fileoffset_t stride = buffersize * m_actual_thread_count;
	tlc_fileoffset_t curoffset = startoffset;
	tlc_fileoffset_t lastmapsize = 0;
	tlc_linecount_t count = 0;
	void *mem = NULL;

	while (curoffset < m_filesize)
	{
		if (m_thread_fail)
		{
			return -1;
		}

		// Get best file mapping window size
		size_t mapsize = (size_t)std::min((m_filesize - curoffset), buffersize);

		// Map view of file
#ifdef _WIN32
		
		if (mem)
		{
			if (!UnmapViewOfFile(mem))
			{
				setLastError(EINVAL, _T("memory unmap failed"));
				m_thread_fail = true;
				return -1;
			}
		}
		mem = MapViewOfFile(m_filemapping, FILE_MAP_READ, (DWORD)(curoffset >> 32), (DWORD)curoffset, (SIZE_T)mapsize);
#else
		if (mem)
		{
			if(munmap(mem, lastmapsize) !=0)
			{
				LCSETREALLASTERROR(EINVAL, _T("memory unmap failed"));
				m_thread_fail = true;
				return -1;
			}
		}
		mem = MMAP(NULL, mapsize, PROT_READ, MAP_FILE | MAP_SHARED, m_fh, curoffset);
//		printf("%p %lld %lld\n",mem, mapsize, curoffset);
#endif		
		if (mem == MAP_FAILED)
		{
			LCSETREALLASTERROR(EINVAL, _T("memory map failed"));
			m_thread_fail = true;
			return -1;
		}

		// Count newlines in buffer
		tlc_fileoffset_t windowoffset = 0;
		size_t windowleft = mapsize;
		char *ptr = (char *)mem;
		while (windowleft > 0)
		{
			char *ptrnext = (char *)memchr(ptr, '\n', windowleft);
			if (ptrnext)
			{
				ptrnext++;
				count++;
				windowleft -= (ptrnext - ptr);
				ptr = ptrnext;
			}
			else
			{
				windowleft = 0;
			}
		}

		// See if we need to account for end of file not ending with line terminator
		if ((curoffset + mapsize) == m_filesize)
		{
			if (*((char *)mem + (mapsize - 1)) != '\n')
			{
				count++;
			}
		}

		// Move to next buffer
		curoffset += stride;
		lastmapsize = mapsize;

//		printf("%lld\n", curoffset);
	}

	// Clean up memory map
#ifdef _WIN32
	if (mem)
	{
		if (!UnmapViewOfFile(mem))
		{
			setLastError(EINVAL, _T("memory unmap failed"));
			m_thread_fail = true;
			return -1;
		}
	}
#else
	if (mem)
	{
		if (munmap(mem, lastmapsize) != 0)
		{
			LCSETREALLASTERROR(EINVAL, _T("memory unmap failed"));
			m_thread_fail = true;
			return -1;
		}
	}
#endif

	// Save count for this thread
	m_threadlinecounts[thread_number] = count;

	return 0;
}